

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall geemuboi::test::core::CpuTest_ld_mhl_b_Test::TestBody(CpuTest_ld_mhl_b_Test *this)

{
  char *message;
  AssertHelper local_88;
  MatcherBase<unsigned_char> local_80;
  Registers expected_regs;
  AssertionResult gtest_ar;
  
  (this->super_CpuTest).regs.f = 0xf0;
  (this->super_CpuTest).regs.b = 0xfe;
  (this->super_CpuTest).regs.h = '3';
  (this->super_CpuTest).regs.l = 'D';
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&expected_regs,0x3344);
  testing::Matcher<unsigned_char>::Matcher
            ((Matcher<unsigned_char> *)&local_80,(this->super_CpuTest).regs.b);
  MockMmu::gmock_write_byte
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)&gtest_ar,&(this->super_CpuTest).mmu,
             (Matcher<unsigned_short> *)&expected_regs,(Matcher<unsigned_char> *)&local_80);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)&gtest_ar,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
             ,0x708,"mmu","write_byte(make_addr(regs.h, regs.l), regs.b)");
  std::_Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>::
  ~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
                *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&local_80);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&expected_regs);
  CpuTest::execute_instruction(&this->super_CpuTest,'p');
  expected_regs.a = '\0';
  expected_regs.b = 0xfe;
  expected_regs.c = '\0';
  expected_regs.d = '\0';
  expected_regs.e = '\0';
  expected_regs.h = '3';
  expected_regs.l = 'D';
  expected_regs.f = 0xf0;
  expected_regs.pc = 1;
  expected_regs.sp = 0;
  CpuTest::verify_state_changes(&this->super_CpuTest,&expected_regs);
  local_80._vptr_MatcherBase._0_4_ =
       (*((this->super_CpuTest).cpu._M_t.
          super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>.
          _M_t.
          super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
          .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_88.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"cpu->get_cycles_executed()","2",(uint *)&local_80,
             (int *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x713,message);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(CpuTest, ld_mhl_b) {
    regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;

    regs.b = 0xFE;
    regs.h = 0x33;
    regs.l = 0x44;

    EXPECT_CALL(mmu, write_byte(make_addr(regs.h, regs.l), regs.b));
    execute_instruction(0x70);

    ICpu::Registers expected_regs{};
    expected_regs.b = 0xFE;
    expected_regs.h = 0x33;
    expected_regs.l = 0x44;
    expected_regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}